

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseDataModuleField(WastParser *this,Module *module)

{
  Var *out_var;
  bool bVar1;
  Result RVar2;
  Enum EVar3;
  undefined1 local_c0 [16];
  Location loc;
  string name;
  Var local_70;
  
  RVar2 = Expect(this,Lpar);
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  GetLocation(&loc,this);
  RVar2 = Expect(this,Data);
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  ParseBindVarOpt(this,&name);
  std::make_unique<wabt::DataSegmentModuleField,wabt::Location&,std::__cxx11::string&>
            ((Location *)local_c0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&loc);
  bVar1 = PeekMatchLpar(this,Memory);
  if (bVar1) {
    RVar2 = Expect(this,Lpar);
    EVar3 = Error;
    if ((((RVar2.enum_ == Error) || (RVar2 = Expect(this,Memory), RVar2.enum_ == Error)) ||
        (RVar2 = ParseVar(this,(Var *)(local_c0._0_8_ + 0x68)), RVar2.enum_ == Error)) ||
       ((RVar2 = Expect(this,Rpar), RVar2.enum_ == Error ||
        (RVar2 = ParseOffsetExpr(this,(ExprList *)(local_c0._0_8_ + 0xb0)), RVar2.enum_ == Error))))
    goto LAB_0017e6de;
LAB_0017e65f:
    ParseTextListOpt(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          (local_c0._0_8_ + 200));
    RVar2 = Expect(this,Rpar);
    if (RVar2.enum_ != Error) {
      local_c0._8_8_ = local_c0._0_8_;
      local_c0._0_8_ = (long *)0x0;
      Module::AppendField(module,(unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                                  *)(local_c0 + 8));
      if ((long *)local_c0._8_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_c0._8_8_ + 8))();
      }
      local_c0._8_8_ = (char *)0x0;
      EVar3 = Ok;
      goto LAB_0017e6de;
    }
  }
  else {
    out_var = (Var *)(local_c0._0_8_ + 0x68);
    Var::Var(&local_70,0,&loc);
    bVar1 = ParseVarOpt(this,out_var,&local_70);
    Var::~Var(&local_70);
    if (!bVar1) {
      bVar1 = ParseOffsetExprOpt(this,(ExprList *)(local_c0._0_8_ + 0xb0));
      if (!bVar1) {
        if (this->options_[9] == (WastParseOptions)0x0) {
          Error(this,0x1d95e1);
          goto LAB_0017e6db;
        }
        *(undefined4 *)(local_c0._0_8_ + 0x40) = 1;
      }
      goto LAB_0017e65f;
    }
    RVar2 = ParseOffsetExpr(this,(ExprList *)(local_c0._0_8_ + 0xb0));
    if (RVar2.enum_ != Error) goto LAB_0017e65f;
  }
LAB_0017e6db:
  EVar3 = Error;
LAB_0017e6de:
  if ((long *)local_c0._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_c0._0_8_ + 8))();
  }
  std::__cxx11::string::_M_dispose();
  return (Result)EVar3;
}

Assistant:

Result WastParser::ParseDataModuleField(Module* module) {
  WABT_TRACE(ParseDataModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Data);
  std::string name;
  ParseBindVarOpt(&name);
  auto field = std::make_unique<DataSegmentModuleField>(loc, name);

  if (PeekMatchLpar(TokenType::Memory)) {
    EXPECT(Lpar);
    EXPECT(Memory);
    CHECK_RESULT(ParseVar(&field->data_segment.memory_var));
    EXPECT(Rpar);
    CHECK_RESULT(ParseOffsetExpr(&field->data_segment.offset));
  } else if (ParseVarOpt(&field->data_segment.memory_var, Var(0, loc))) {
    CHECK_RESULT(ParseOffsetExpr(&field->data_segment.offset));
  } else if (!ParseOffsetExprOpt(&field->data_segment.offset)) {
    if (!options_->features.bulk_memory_enabled()) {
      Error(loc, "passive data segments are not allowed");
      return Result::Error;
    }

    field->data_segment.kind = SegmentKind::Passive;
  }

  ParseTextListOpt(&field->data_segment.data);
  EXPECT(Rpar);
  module->AppendField(std::move(field));
  return Result::Ok;
}